

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsender.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  SocketLog *this;
  size_t sVar2;
  int *piVar3;
  ulong uVar4;
  char buf [1024];
  string local_478;
  _Any_data local_458;
  code *local_448;
  code *local_440;
  char local_438 [1032];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Send string every 1s...",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  this = SocketLog::getInstance();
  local_458._M_unused._M_object = (void *)0x0;
  local_458._8_8_ = 0;
  local_440 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]SocketLog/examples/loopsender.cpp:12:35)>
              ::_M_invoke;
  local_448 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]SocketLog/examples/loopsender.cpp:12:35)>
              ::_M_manager;
  SocketLog::setSendInterceptor(this,(Interceptor *)&local_458);
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  uVar4 = 0;
  do {
    sprintf(local_438,"hello, count=%d\n",uVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"try to send:",0xc);
    sVar2 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_438,sVar2);
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    sVar2 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_478,local_438,local_438 + sVar2);
    SocketLog::post(this,&local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    uVar4 = (ulong)((int)uVar4 + 1);
    local_478._M_dataplus._M_p = (pointer)0x1;
    local_478._M_string_length = 0;
    do {
      iVar1 = nanosleep((timespec *)&local_478,(timespec *)&local_478);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  } while( true );
}

Assistant:

int main() {
    cout<<"Send string every 1s..."<<endl;

    auto socketLog = SocketLog::getInstance();

    socketLog->setSendInterceptor([](const std::string msg) {
        cout<<"SendInterceptor: "<<msg<<endl;
        return false;
    });

    char buf[1024];
    int count = 0;
    while (true) {
        sprintf(buf, "hello, count=%d\n", count++);
        cout<<"try to send:"<<buf;
        socketLog->post(buf);
        std::this_thread::sleep_for(std::chrono::seconds(1));
    }
    return 0;
}